

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
make_root(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
          *this)

{
  bool bVar1;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
  *pbVar2;
  template_ElementType<0UL> *ppbVar3;
  
  pbVar2 = parent(this);
  bVar1 = is_root(pbVar2);
  if (bVar1) {
    pbVar2 = parent(this);
    pbVar2 = parent(pbVar2);
    ppbVar3 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
              ::GetField<0ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
                               *)this);
    *ppbVar3 = pbVar2;
    return;
  }
  __assert_fail("parent()->is_root()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x4ad,
                "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>>::make_root() [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>]"
               );
}

Assistant:

void make_root() {
            assert(parent()->is_root());
            set_parent(parent()->parent());
        }